

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::SetScriptWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          uint32_t witness_index,ByteData256 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  ByteData256::GetBytes(&local_40,data);
  SetScriptWitnessStack(__return_storage_ptr__,this,tx_in_index,witness_index,&local_40);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::SetScriptWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index, const ByteData256 &data) {
  return SetScriptWitnessStack(tx_in_index, witness_index, data.GetBytes());
}